

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparator.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_2::BytewiseComparatorImpl::FindShortestSeparator
          (BytewiseComparatorImpl *this,string *start,Slice *limit)

{
  ulong uVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  unsigned_long *puVar5;
  reference pvVar6;
  byte *pbVar7;
  undefined8 in_RDX;
  long *in_RDI;
  long in_FS_OFFSET;
  uint8_t diff_byte;
  size_t diff_index;
  size_t min_length;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uint uVar8;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  ulong local_50;
  undefined1 local_28 [16];
  size_t local_18;
  size_type local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                       (in_stack_ffffffffffffff88);
  local_18 = Slice::size((Slice *)in_stack_ffffffffffffff88);
  puVar5 = std::min<unsigned_long>
                     ((unsigned_long *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                      ,(unsigned_long *)in_stack_ffffffffffffff88);
  uVar1 = *puVar5;
  local_50 = 0;
  while( true ) {
    uVar8 = in_stack_ffffffffffffff9c & 0xffffff;
    if (local_50 < uVar1) {
      pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98) &
                          0xffffffffffffff),
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      in_stack_ffffffffffffff98 = (int)*pvVar6;
      cVar2 = Slice::operator[]((Slice *)CONCAT17(in_stack_ffffffffffffffaf,
                                                  in_stack_ffffffffffffffa8),(size_t)in_RDI);
      uVar8 = CONCAT13(in_stack_ffffffffffffff98 == cVar2,(int3)uVar8);
    }
    if ((char)(uVar8 >> 0x18) == '\0') break;
    local_50 = local_50 + 1;
    in_stack_ffffffffffffff9c = uVar8;
  }
  if (local_50 < uVar1) {
    pbVar7 = (byte *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(uVar8,in_stack_ffffffffffffff98),
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    bVar3 = *pbVar7;
    if (bVar3 != 0xff) {
      iVar4 = bVar3 + 1;
      bVar3 = Slice::operator[]((Slice *)CONCAT17(bVar3,in_stack_ffffffffffffffa8),(size_t)in_RDI);
      if (iVar4 < (int)(uint)bVar3) {
        pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(uVar8,in_stack_ffffffffffffff98),
                            CONCAT44(iVar4,in_stack_ffffffffffffff90));
        *pvVar6 = *pvVar6 + '\x01';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                  (in_stack_ffffffffffffff88,0x18ca737);
        Slice::Slice((Slice *)CONCAT44(uVar8,in_stack_ffffffffffffff98),
                     (string *)CONCAT44(iVar4,in_stack_ffffffffffffff90));
        iVar4 = (**(code **)(*in_RDI + 0x10))(in_RDI,local_28,in_RDX);
        if (-1 < iVar4) {
          __assert_fail("Compare(*start, limit) < 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/comparator.cc"
                        ,0x31,
                        "virtual void leveldb::(anonymous namespace)::BytewiseComparatorImpl::FindShortestSeparator(std::string *, const Slice &) const"
                       );
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void FindShortestSeparator(std::string* start,
                             const Slice& limit) const override {
    // Find length of common prefix
    size_t min_length = std::min(start->size(), limit.size());
    size_t diff_index = 0;
    while ((diff_index < min_length) &&
           ((*start)[diff_index] == limit[diff_index])) {
      diff_index++;
    }

    if (diff_index >= min_length) {
      // Do not shorten if one string is a prefix of the other
    } else {
      uint8_t diff_byte = static_cast<uint8_t>((*start)[diff_index]);
      if (diff_byte < static_cast<uint8_t>(0xff) &&
          diff_byte + 1 < static_cast<uint8_t>(limit[diff_index])) {
        (*start)[diff_index]++;
        start->resize(diff_index + 1);
        assert(Compare(*start, limit) < 0);
      }
    }
  }